

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *ofs,vector<float,_std::allocator<float>_> *v)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  allocator local_c1;
  string local_c0 [32];
  ulong local_a0;
  size_t i;
  char buf [128];
  vector<float,_std::allocator<float>_> *v_local;
  ostream *ofs_local;
  
  buf._120_8_ = v;
  std::operator<<(ofs,"[");
  local_a0 = 0;
  while( true ) {
    uVar1 = local_a0;
    sVar2 = vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)buf._120_8_);
    if (sVar2 <= uVar1) break;
    if (local_a0 != 0) {
      std::operator<<(ofs,", ");
    }
    pvVar3 = vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)buf._120_8_,local_a0);
    floaxie::ftoa<float,char>(*pvVar3,(char *)&i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,(char *)&i,&local_c1);
    std::operator<<(ofs,local_c0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_a0 = local_a0 + 1;
  }
  std::operator<<(ofs,"]");
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<float> &v) {
  // Use floaxie
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    floaxie::ftoa(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}